

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messagebox.cpp
# Opt level: O0

void __thiscall
QtMWidgets::MessageBoxPrivate::MessageBoxPrivate
          (MessageBoxPrivate *this,QString *titl,QString *txt,MessageBox *parent,QWidget *w)

{
  QWidget *w_local;
  MessageBox *parent_local;
  QString *txt_local;
  QString *titl_local;
  MessageBoxPrivate *this_local;
  
  this->q = parent;
  QMap<QAbstractButton_*,_QtMWidgets::MessageBox::ButtonRole>::QMap(&this->buttonsMap);
  this->frame = (QFrame *)0x0;
  this->vbox = (QVBoxLayout *)0x0;
  this->hbox = (QHBoxLayout *)0x0;
  this->title = (MsgBoxTitle *)0x0;
  this->scrollArea = (ScrollArea *)0x0;
  this->textLabel = (TextLabel *)0x0;
  this->okButton = (MsgBoxButton *)0x0;
  QList<QFrame_*>::QList(&this->buttonSeparators);
  this->clickedButton = (QAbstractButton *)0x0;
  QList<QAbstractButton_*>::QList(&this->buttons);
  this->screenMargin = 6;
  this->window = w;
  this->h1 = (QFrame *)0x0;
  this->h2 = (QFrame *)0x0;
  init(this,(EVP_PKEY_CTX *)titl);
  return;
}

Assistant:

MessageBoxPrivate( const QString & titl,
		const QString & txt, MessageBox * parent, QWidget * w )
		:	q( parent )
		,	frame( 0 )
		,	vbox( 0 )
		,	hbox( 0 )
		,	title( 0 )
		,	scrollArea( 0 )
		,	textLabel( 0 )
		,	okButton( 0 )
		,	clickedButton( 0 )
		,	screenMargin( 6 )
		,	window( w )
		,	h1( 0 )
		,	h2( 0 )
	{
		init( titl, txt );
	}